

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O2

QList<QListWidgetItem_*> * __thiscall
QListWidget::findItems
          (QList<QListWidgetItem_*> *__return_storage_ptr__,QListWidget *this,QString *text,
          MatchFlags flags)

{
  QListWidgetPrivate *this_00;
  qsizetype qVar1;
  int iVar2;
  QListModel *pQVar3;
  QAbstractItemModel *pQVar4;
  ulong uVar5;
  ulong uVar6;
  QListWidgetItem *t;
  ulong uVar7;
  long in_FS_OFFSET;
  undefined1 local_90 [24];
  QArrayDataPointer<QModelIndex> local_78;
  QVariant local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QListWidgetPrivate **)
             &(this->super_QListView).super_QAbstractItemView.super_QAbstractScrollArea.super_QFrame
              .super_QWidget.field_0x8;
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar3 = QListWidgetPrivate::listModel(this_00);
  pQVar4 = QAbstractItemView::model((QAbstractItemView *)this);
  uVar6 = 0;
  (**(code **)(*(long *)pQVar4 + 0x60))(local_90,pQVar4,0,0);
  ::QVariant::QVariant(&local_58,(QString *)text);
  (**(code **)(*(long *)pQVar3 + 0x150))
            (&local_78,pQVar3,local_90,0,&local_58,0xffffffffffffffff,
             flags.super_QFlagsStorageHelper<Qt::MatchFlag,_4>.super_QFlagsStorage<Qt::MatchFlag>.i)
  ;
  ::QVariant::~QVariant(&local_58);
  qVar1 = local_78.size;
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QListWidgetItem **)0x0;
  iVar2 = (int)local_78.size;
  QList<QListWidgetItem_*>::reserve(__return_storage_ptr__,(long)iVar2);
  uVar7 = qVar1 & 0xffffffff;
  if (iVar2 < 1) {
    uVar7 = uVar6;
  }
  for (; uVar7 * 0x18 - uVar6 != 0; uVar6 = uVar6 + 0x18) {
    pQVar3 = QListWidgetPrivate::listModel(this_00);
    uVar5 = (ulong)*(int *)((long)&(local_78.ptr)->r + uVar6);
    if (uVar5 < (ulong)(pQVar3->items).d.size) {
      t = (pQVar3->items).d.ptr[uVar5];
    }
    else {
      t = (parameter_type)0x0;
    }
    QList<QListWidgetItem_*>::append(__return_storage_ptr__,t);
  }
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QListWidgetItem*> QListWidget::findItems(const QString &text, Qt::MatchFlags flags) const
{
    Q_D(const QListWidget);
    QModelIndexList indexes = d->listModel()->match(model()->index(0, 0, QModelIndex()),
                                                Qt::DisplayRole, text, -1, flags);
    QList<QListWidgetItem*> items;
    const int indexesSize = indexes.size();
    items.reserve(indexesSize);
    for (int i = 0; i < indexesSize; ++i)
        items.append(d->listModel()->at(indexes.at(i).row()));
    return items;
}